

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_140180b::TransformSelectorFor::Validate(TransformSelectorFor *this,size_t count)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  runtime_error *this_00;
  int iVar4;
  string sStack_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  iVar2 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Start,count);
  this->Start = iVar2;
  iVar2 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Stop,count);
  this->Stop = iVar2;
  if (this->Start <= iVar2) {
    iVar2 = (iVar2 - this->Start) + 1;
    std::vector<int,_std::allocator<int>_>::resize
              (&(this->super_TransformSelectorIndexes).Indexes,
               (long)(int)((iVar2 / this->Step + 1) - (uint)(iVar2 % this->Step == 0)));
    piVar3 = (this->super_TransformSelectorIndexes).Indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar1 = (this->super_TransformSelectorIndexes).Indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    if (piVar3 != piVar1) {
      iVar2 = this->Step;
      iVar4 = this->Start;
      do {
        *piVar3 = iVar4;
        iVar4 = iVar4 + iVar2;
        piVar3 = piVar3 + 1;
      } while (piVar3 != piVar1);
    }
    return true;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_78.View_._M_len = 0x52;
  local_78.View_._M_str =
       "sub-command TRANSFORM, selector FOR expects <start> to be no greater than <stop> (";
  cmAlphaNum::cmAlphaNum(&local_48,this->Start);
  cmStrCat<char[4],int,char[2]>
            (&sStack_98,&local_78,&local_48,(char (*) [4])" > ",&this->Stop,(char (*) [2])0x7a4478);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_98);
  *(undefined ***)this_00 = &PTR__runtime_error_009655f0;
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

bool Validate(std::size_t count) override
  {
    this->Start = this->NormalizeIndex(this->Start, count);
    this->Stop = this->NormalizeIndex(this->Stop, count);

    // Does stepping move us further from the end?
    if (this->Start > this->Stop) {
      throw transform_error(
        cmStrCat("sub-command TRANSFORM, selector FOR "
                 "expects <start> to be no greater than <stop> (",
                 this->Start, " > ", this->Stop, ")"));
    }

    // compute indexes
    auto size = (this->Stop - this->Start + 1) / this->Step;
    if ((this->Stop - this->Start + 1) % this->Step != 0) {
      size += 1;
    }

    this->Indexes.resize(size);
    auto start = this->Start;
    auto step = this->Step;
    std::generate(this->Indexes.begin(), this->Indexes.end(),
                  [&start, step]() -> int {
                    auto r = start;
                    start += step;
                    return r;
                  });

    return true;
  }